

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

int __thiscall mkvmuxer::Segment::WriteFramesAll(Segment *this)

{
  Cluster *this_00;
  Frame *pFVar1;
  bool bVar2;
  Frame **ppFVar3;
  int64_t iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int result;
  Frame **frame;
  int32_t i;
  Cluster *cluster;
  Segment *this_local;
  
  if (this->frames_ == (Frame **)0x0) {
    this_local._4_4_ = 0;
  }
  else if (this->cluster_list_size_ < 1) {
    this_local._4_4_ = -1;
  }
  else {
    this_00 = this->cluster_list_[this->cluster_list_size_ + -1];
    if (this_00 == (Cluster *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      for (frame._4_4_ = 0; frame._4_4_ < this->frames_size_; frame._4_4_ = frame._4_4_ + 1) {
        ppFVar3 = this->frames_ + frame._4_4_;
        iVar4 = Frame::discard_padding(*ppFVar3);
        if (iVar4 != 0) {
          this->doc_type_version_ = 4;
        }
        bVar2 = Cluster::AddFrame(this_00,*ppFVar3);
        if (bVar2) {
          if (((this->new_cuepoint_ & 1U) != 0) &&
             (uVar6 = this->cues_track_, uVar5 = Frame::track_number(*ppFVar3), uVar6 == uVar5)) {
            uVar6 = Frame::timestamp(*ppFVar3);
            bVar2 = AddCuePoint(this,uVar6,this->cues_track_);
            if (!bVar2) {
              pFVar1 = *ppFVar3;
              if (pFVar1 != (Frame *)0x0) {
                Frame::~Frame(pFVar1);
                operator_delete(pFVar1);
              }
              goto LAB_00145f7a;
            }
          }
          uVar6 = Frame::timestamp(*ppFVar3);
          if (this->last_timestamp_ < uVar6) {
            uVar6 = Frame::timestamp(*ppFVar3);
            this->last_timestamp_ = uVar6;
            uVar6 = Frame::timestamp(*ppFVar3);
            uVar5 = Frame::track_number(*ppFVar3);
            this->last_track_timestamp_[uVar5 - 1] = uVar6;
          }
          pFVar1 = *ppFVar3;
          if (pFVar1 != (Frame *)0x0) {
            Frame::~Frame(pFVar1);
            operator_delete(pFVar1);
          }
          *ppFVar3 = (Frame *)0x0;
        }
        else {
          pFVar1 = *ppFVar3;
          if (pFVar1 != (Frame *)0x0) {
            Frame::~Frame(pFVar1);
            operator_delete(pFVar1);
          }
        }
LAB_00145f7a:
      }
      this_local._4_4_ = this->frames_size_;
      this->frames_size_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Segment::WriteFramesAll() {
  if (frames_ == NULL)
    return 0;

  if (cluster_list_size_ < 1)
    return -1;

  Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];

  if (!cluster)
    return -1;

  for (int32_t i = 0; i < frames_size_; ++i) {
    Frame*& frame = frames_[i];
    // TODO(jzern/vigneshv): using Segment::AddGenericFrame here would limit the
    // places where |doc_type_version_| needs to be updated.
    if (frame->discard_padding() != 0)
      doc_type_version_ = 4;
    if (!cluster->AddFrame(frame)) {
      delete frame;
      continue;
    }

    if (new_cuepoint_ && cues_track_ == frame->track_number()) {
      if (!AddCuePoint(frame->timestamp(), cues_track_)) {
        delete frame;
        continue;
      }
    }

    if (frame->timestamp() > last_timestamp_) {
      last_timestamp_ = frame->timestamp();
      last_track_timestamp_[frame->track_number() - 1] = frame->timestamp();
    }

    delete frame;
    frame = NULL;
  }

  const int result = frames_size_;
  frames_size_ = 0;

  return result;
}